

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O0

void sweep2old(lua_State *L,GCObject **p)

{
  global_State *pgVar1;
  GCObject *o;
  lua_State *th;
  global_State *g;
  GCObject *curr;
  GCObject **p_local;
  lua_State *L_local;
  
  pgVar1 = L->l_G;
  curr = (GCObject *)p;
  while (o = curr->next, o != (GCObject *)0x0) {
    if ((o->marked & 0x18) == 0) {
      o->marked = o->marked & 0xf8 | 4;
      curr = o;
      if (o->tt == '\b') {
        linkgclist_(o,(GCObject **)&o[4].tt,&pgVar1->grayagain);
      }
      else if ((o->tt == '\t') && (o[1].next != (GCObject *)&o[1].tt)) {
        o->marked = o->marked & 199;
      }
      else {
        o->marked = o->marked | 0x20;
      }
    }
    else {
      curr->next = o->next;
      freeobj(L,o);
    }
  }
  return;
}

Assistant:

static void sweep2old (lua_State *L, GCObject **p) {
  GCObject *curr;
  global_State *g = G(L);
  while ((curr = *p) != NULL) {
    if (iswhite(curr)) {  /* is 'curr' dead? */
      lua_assert(isdead(g, curr));
      *p = curr->next;  /* remove 'curr' from list */
      freeobj(L, curr);  /* erase 'curr' */
    }
    else {  /* all surviving objects become old */
      setage(curr, G_OLD);
      if (curr->tt == LUA_VTHREAD) {  /* threads must be watched */
        lua_State *th = gco2th(curr);
        linkgclist(th, g->grayagain);  /* insert into 'grayagain' list */
      }
      else if (curr->tt == LUA_VUPVAL && upisopen(gco2upv(curr)))
        set2gray(curr);  /* open upvalues are always gray */
      else  /* everything else is black */
        nw2black(curr);
      p = &curr->next;  /* go to next element */
    }
  }
}